

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pairwise_tests.cpp
# Opt level: O3

void __thiscall iu_PairwiseTest_x_iutest_x_Num_Test::Body(iu_PairwiseTest_x_iutest_x_Num_Test *this)

{
  ParamType *pPVar1;
  
  pPVar1 = iutest::WithParamInterface<std::tuple<int,_int,_int,_int,_int,_int,_int,_int,_int>_>::
           GetParam();
  printf("%d %d %d %d %d %d %d %d %d\n",
         (ulong)(uint)(pPVar1->super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_int,_int,_int,_int>).
                      super__Head_base<0UL,_int,_false>._M_head_impl,
         (ulong)(uint)(pPVar1->super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_int,_int,_int,_int>).
                      super__Tuple_impl<1UL,_int,_int,_int,_int,_int,_int,_int,_int>.
                      super__Head_base<1UL,_int,_false>._M_head_impl,
         (ulong)(uint)(pPVar1->super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_int,_int,_int,_int>).
                      super__Tuple_impl<1UL,_int,_int,_int,_int,_int,_int,_int,_int>.
                      super__Tuple_impl<2UL,_int,_int,_int,_int,_int,_int,_int>.
                      super__Head_base<2UL,_int,_false>._M_head_impl,
         (ulong)(uint)(pPVar1->super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_int,_int,_int,_int>).
                      super__Tuple_impl<1UL,_int,_int,_int,_int,_int,_int,_int,_int>.
                      super__Tuple_impl<2UL,_int,_int,_int,_int,_int,_int,_int>.
                      super__Tuple_impl<3UL,_int,_int,_int,_int,_int,_int>.
                      super__Head_base<3UL,_int,_false>._M_head_impl,
         (ulong)(uint)(pPVar1->super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_int,_int,_int,_int>).
                      super__Tuple_impl<1UL,_int,_int,_int,_int,_int,_int,_int,_int>.
                      super__Tuple_impl<2UL,_int,_int,_int,_int,_int,_int,_int>.
                      super__Tuple_impl<3UL,_int,_int,_int,_int,_int,_int>.
                      super__Tuple_impl<4UL,_int,_int,_int,_int,_int>.
                      super__Head_base<4UL,_int,_false>._M_head_impl,
         (ulong)(uint)(pPVar1->super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_int,_int,_int,_int>).
                      super__Tuple_impl<1UL,_int,_int,_int,_int,_int,_int,_int,_int>.
                      super__Tuple_impl<2UL,_int,_int,_int,_int,_int,_int,_int>.
                      super__Tuple_impl<3UL,_int,_int,_int,_int,_int,_int>.
                      super__Tuple_impl<4UL,_int,_int,_int,_int,_int>.
                      super__Tuple_impl<5UL,_int,_int,_int,_int>.super__Head_base<5UL,_int,_false>.
                      _M_head_impl,
         (ulong)(uint)((_Head_base<6UL,_int,_false> *)
                      ((long)&(pPVar1->
                              super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_int,_int,_int,_int>).
                              super__Tuple_impl<1UL,_int,_int,_int,_int,_int,_int,_int,_int>.
                              super__Tuple_impl<2UL,_int,_int,_int,_int,_int,_int,_int>.
                              super__Tuple_impl<3UL,_int,_int,_int,_int,_int,_int>.
                              super__Tuple_impl<4UL,_int,_int,_int,_int,_int>.
                              super__Tuple_impl<5UL,_int,_int,_int,_int>.
                              super__Tuple_impl<6UL,_int,_int,_int> + 8))->_M_head_impl,
         (ulong)(uint)((_Head_base<7UL,_int,_false> *)
                      ((long)&(pPVar1->
                              super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_int,_int,_int,_int>).
                              super__Tuple_impl<1UL,_int,_int,_int,_int,_int,_int,_int,_int>.
                              super__Tuple_impl<2UL,_int,_int,_int,_int,_int,_int,_int>.
                              super__Tuple_impl<3UL,_int,_int,_int,_int,_int,_int>.
                              super__Tuple_impl<4UL,_int,_int,_int,_int,_int>.
                              super__Tuple_impl<5UL,_int,_int,_int,_int>.
                              super__Tuple_impl<6UL,_int,_int,_int> + 4))->_M_head_impl,
         (ulong)*(uint *)&(pPVar1->
                          super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_int,_int,_int,_int>).
                          super__Tuple_impl<1UL,_int,_int,_int,_int,_int,_int,_int,_int>.
                          super__Tuple_impl<2UL,_int,_int,_int,_int,_int,_int,_int>.
                          super__Tuple_impl<3UL,_int,_int,_int,_int,_int,_int>.
                          super__Tuple_impl<4UL,_int,_int,_int,_int,_int>.
                          super__Tuple_impl<5UL,_int,_int,_int,_int>.
                          super__Tuple_impl<6UL,_int,_int,_int>);
  return;
}

Assistant:

IUTEST_P(PairwiseTest, Num)
{
#ifndef USE_PROGRESS
    PairwiseTestTuple param = GetParam();
    printf("%d %d %d %d %d %d %d %d %d\n"
        , ::iutest::tuples::get<0>(param)
        , ::iutest::tuples::get<1>(param)
        , ::iutest::tuples::get<2>(param)
        , ::iutest::tuples::get<3>(param)
        , ::iutest::tuples::get<4>(param)
        , ::iutest::tuples::get<5>(param)
        , ::iutest::tuples::get<6>(param)
        , ::iutest::tuples::get<7>(param)
        , ::iutest::tuples::get<8>(param)
    );
#endif
}